

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor_test.cc
# Opt level: O0

void google::protobuf::anon_unknown_0::TestHandle
               (Descriptor *message,DescriptorProto *proto,
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *result)

{
  bool bVar1;
  string *rhs;
  char *message_00;
  AssertHelper local_70 [3];
  Message local_58;
  string_view local_50;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *result_local;
  DescriptorProto *proto_local;
  Descriptor *message_local;
  
  if (result != (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)0x0) {
    join_0x00000010_0x00000000_ = Descriptor::full_name(message);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back(result,(value_type *)&gtest_ar.message_);
  }
  local_50 = Descriptor::name(message);
  rhs = DescriptorProto::name_abi_cxx11_(proto);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_40,"message.name()","proto.name()",&local_50,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_visitor_test.cc"
               ,0x75,message_00);
    testing::internal::AssertHelper::operator=(local_70,&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

void TestHandle(const Descriptor& message, const DescriptorProto& proto,
                std::vector<absl::string_view>* result) {
  if (result != nullptr) result->push_back(message.full_name());
  EXPECT_EQ(message.name(), proto.name());
}